

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortrc_p.h
# Opt level: O0

float __thiscall QColorTrc::applyExtended(QColorTrc *this,float x)

{
  QColorTrc *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  undefined4 extraout_XMM0_Db;
  double dVar2;
  QColorTransferTable *unaff_retaddr;
  undefined8 in_stack_ffffffffffffffd8;
  QColorTrc *pQVar3;
  Type TVar4;
  float local_4;
  
  fVar1 = (float)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  TVar4 = in_RDI->m_type;
  if (TVar4 == ParameterizedFunction) {
    pQVar3 = in_RDI;
    fun(in_RDI);
    fVar1 = (float)((ulong)pQVar3 >> 0x20);
    std::abs((int)in_RDI);
    fVar1 = QColorTransferFunction::apply
                      ((QColorTransferFunction *)CONCAT44(in_XMM0_Da,TVar4),fVar1);
    dVar2 = std::copysign((double)CONCAT44(extraout_XMM0_Db,fVar1),(double)(ulong)(uint)in_XMM0_Da);
    local_4 = SUB84(dVar2,0);
  }
  else if (TVar4 == GenericFunction) {
    hdr(in_RDI);
    local_4 = QColorTransferGenericFunction::apply((QColorTransferGenericFunction *)in_RDI,fVar1);
  }
  else {
    local_4 = in_XMM0_Da;
    if (TVar4 == Table) {
      table(in_RDI);
      local_4 = QColorTransferTable::apply(unaff_retaddr,this._4_4_);
    }
  }
  return local_4;
}

Assistant:

float applyExtended(float x) const
    {
        switch (m_type) {
        case Type::ParameterizedFunction:
            return std::copysign(fun().apply(std::abs(x)), x);
        case Type::GenericFunction:
            return hdr().apply(x);
        case Type::Table:
            return table().apply(x);
        default:
            break;
        }
        return x;
    }